

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsproxywidget.cpp
# Opt level: O2

void __thiscall
QGraphicsProxyWidget::hoverLeaveEvent(QGraphicsProxyWidget *this,QGraphicsSceneHoverEvent *event)

{
  QWeakPointer<QObject> *this_00;
  long lVar1;
  bool bVar2;
  QPoint QVar3;
  QWidget *leave;
  long in_FS_OFFSET;
  QPointF local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 0x18);
  this_00 = (QWeakPointer<QObject> *)(lVar1 + 0x218);
  bVar2 = QPointer::operator_cast_to_bool((QPointer *)this_00);
  if (bVar2) {
    if ((this_00->d == (Data *)0x0) || (*(int *)(this_00->d + 4) == 0)) {
      leave = (QWidget *)0x0;
    }
    else {
      leave = *(QWidget **)(lVar1 + 0x220);
    }
    QVar3 = QGraphicsSceneHoverEvent::screenPos(event);
    local_30.xp = (qreal)QVar3.xp.m_i.m_i;
    local_30.yp = (qreal)QVar3.yp.m_i.m_i;
    QApplicationPrivate::dispatchEnterLeave((QWidget *)0x0,leave,&local_30);
    QWeakPointer<QObject>::assign<QObject>(this_00,(QObject *)0x0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsProxyWidget::hoverLeaveEvent(QGraphicsSceneHoverEvent *event)
{
    Q_UNUSED(event);
    Q_D(QGraphicsProxyWidget);
    // If hoverMove was compressed away, make sure we update properly here.
    if (d->lastWidgetUnderMouse) {
        QApplicationPrivate::dispatchEnterLeave(nullptr, d->lastWidgetUnderMouse, event->screenPos());
        d->lastWidgetUnderMouse = nullptr;
    }
}